

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComments.cpp
# Opt level: O0

void __thiscall
RemoveCommentsTest_testSingleLineComments_Test::TestBody
          (RemoveCommentsTest_testSingleLineComments_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *__dest;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  char *szTestResult;
  char *szTest2;
  size_t len;
  char *szTest;
  RemoveCommentsTest_testSingleLineComments_Test *this_local;
  
  sVar2 = strlen(
                "int i = 0; \nif (4 == //)\n\ttrue) { // do something here \n\t// hello ... and bye //\n"
                );
  __dest = (char *)operator_new__(sVar2 + 1);
  strncpy(__dest,
          "int i = 0; \nif (4 == //)\n\ttrue) { // do something here \n\t// hello ... and bye //\n",
          sVar2 + 1);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)anon_var_dwarf_1d8c51;
  Assimp::CommentRemover::RemoveLineComments("//",__dest,' ');
  testing::internal::CmpHelperSTREQ
            ((internal *)local_40,"szTestResult","szTest2",(char *)gtest_ar.message_.ptr_,__dest);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComments.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (__dest != (char *)0x0) {
    operator_delete__(__dest);
  }
  return;
}

Assistant:

TEST(RemoveCommentsTest, testSingleLineComments)
{
    const char* szTest = "int i = 0; \n"
        "if (4 == //)\n"
        "\ttrue) { // do something here \n"
        "\t// hello ... and bye //\n";

    const size_t len( ::strlen( szTest ) + 1 );
    char* szTest2 = new char[ len ];
    ::strncpy( szTest2, szTest, len );

    const char* szTestResult = "int i = 0; \n"
        "if (4 ==    \n"
        "\ttrue) {                      \n"
        "\t                       \n";

    CommentRemover::RemoveLineComments("//",szTest2,' ');
    EXPECT_STREQ(szTestResult, szTest2);

    delete[] szTest2;
}